

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphMaker.cc
# Opt level: O2

void __thiscall
GraphMaker::new_graph_from_kmerlist_128
          (GraphMaker *this,vector<unsigned___int128,_std::allocator<unsigned___int128>_> *kmerlist,
          uint8_t k)

{
  ulong *puVar1;
  char *pcVar2;
  byte bVar3;
  SequenceDistanceGraph *pSVar4;
  pointer puVar5;
  pointer puVar6;
  pointer pNVar7;
  ulong uVar8;
  _Bit_reference __y;
  undefined1 kmer [16];
  undefined1 kmer_00 [16];
  undefined1 VAL [16];
  undefined1 kmer_01 [16];
  undefined1 VAL_00 [16];
  undefined1 kmer_02 [16];
  undefined1 VAL_01 [16];
  undefined1 kmer_03 [16];
  undefined1 VAL_02 [16];
  undefined1 kmer_04 [16];
  undefined1 kmer_05 [16];
  undefined1 VAL_03 [16];
  undefined1 kmer_06 [16];
  undefined1 VAL_04 [16];
  undefined1 kmer_07 [16];
  undefined1 VAL_05 [16];
  undefined1 kmer_08 [16];
  undefined1 VAL_06 [16];
  undefined1 kmer_09 [16];
  undefined1 kmer_10 [16];
  undefined1 kmer_11 [16];
  undefined1 kmer_12 [16];
  undefined1 kmer_13 [16];
  undefined1 kmer_14 [16];
  undefined1 kmer_15 [16];
  undefined1 kmer_16 [16];
  undefined1 kmer_17 [16];
  undefined1 kmer_18 [16];
  undefined1 kmer_19 [16];
  undefined1 kmer_20 [16];
  _Bit_reference __x;
  pointer ppVar9;
  pointer pkVar10;
  pointer pkVar11;
  bool bVar12;
  uint uVar13;
  ostream *poVar14;
  __normal_iterator<const_unsigned___int128_*,_std::vector<unsigned___int128,_std::allocator<unsigned___int128>_>_>
  _Var15;
  __uint128_t *p_Var16;
  __uint128_t *p_Var17;
  long lVar18;
  int64_t extraout_RDX;
  int64_t extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  int64_t extraout_RDX_03;
  ulong uVar19;
  pointer ppVar20;
  int iVar21;
  pointer ppVar22;
  vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>> *this_00
  ;
  long lVar23;
  vector<unsigned___int128,_std::allocator<unsigned___int128>_> *pvVar24;
  uint64_t i;
  ulong uVar25;
  ulong uVar26;
  undefined1 auVar27 [16];
  reference rVar28;
  _Bit_type in_stack_fffffffffffffb18;
  uint uVar29;
  undefined4 uVar30;
  vector<unsigned___int128,_std::allocator<unsigned___int128>_> *pvVar31;
  vector<unsigned___int128,_std::allocator<unsigned___int128>_> *V;
  long local_4d0;
  ulong local_4c8;
  ulong local_4b8;
  uint local_4ac;
  vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
  in;
  vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
  out;
  int local_46c;
  array<unsigned___int128,_4UL> bns;
  string s;
  vector<kcontext,_std::allocator<kcontext>_> kcontextlist;
  vector<bool,_std::allocator<bool>_> used_kmers;
  vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
  last;
  vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
  first;
  vector<bool,_std::allocator<bool>_> is_end_bw;
  vector<bool,_std::allocator<bool>_> is_end_fw;
  CStringKMerFactory128 skf_ovl;
  Node local_d8;
  Node local_a0;
  Node local_68;
  
  std::vector<Node,_std::allocator<Node>_>::clear(&this->sg->nodes);
  std::
  vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
  ::clear(&(this->sg->super_DistanceGraph).links);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->sg->oldnames);
  pSVar4 = this->sg;
  std::__cxx11::string::string((string *)&skf_ovl,"",(allocator *)&bns);
  Node::Node(&local_d8,(string *)&skf_ovl,Deleted);
  SequenceDistanceGraph::add_node(pSVar4,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&skf_ovl);
  poVar14 = sdglib::OutputLog(INFO,true);
  poVar14 = std::operator<<(poVar14,"Constructing Graph from ");
  poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
  poVar14 = std::operator<<(poVar14," ");
  uVar29 = (uint)k;
  uVar30 = 0;
  std::__cxx11::to_string((string *)&skf_ovl,(uint)k);
  poVar14 = std::operator<<(poVar14,(string *)&skf_ovl);
  poVar14 = std::operator<<(poVar14,"-mers");
  std::endl<char,std::char_traits<char>>(poVar14);
  std::__cxx11::string::~string((string *)&skf_ovl);
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&s);
  pvVar31 = kmerlist;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&used_kmers,
             (long)(kmerlist->
                   super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(kmerlist->
                   super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)&skf_ovl);
  std::vector<kcontext,_std::allocator<kcontext>_>::vector
            (&kcontextlist,
             (long)(kmerlist->
                   super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(kmerlist->
                   super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)&skf_ovl);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&is_end_fw,
             (long)(kmerlist->
                   super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(kmerlist->
                   super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)&skf_ovl);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&is_end_bw,
             (long)(kmerlist->
                   super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(kmerlist->
                   super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)&skf_ovl);
  poVar14 = sdglib::OutputLog(INFO,true);
  poVar14 = std::operator<<(poVar14,"Finding neighbours");
  std::endl<char,std::char_traits<char>>(poVar14);
  uVar19 = 0;
  V = pvVar31;
  for (uVar25 = 0;
      puVar5 = (V->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
               _M_impl.super__Vector_impl_data._M_start,
      uVar25 < (ulong)((long)(V->
                             super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 4);
      uVar25 = uVar25 + 1) {
    kmer._8_4_ = uVar29;
    kmer._0_8_ = in_stack_fffffffffffffb18;
    kmer._12_4_ = uVar30;
    pvVar24 = V;
    kmer_fw_neighbours128
              ((array<unsigned___int128,_4UL> *)&skf_ovl,(__uint128_t)kmer,
               (uint8_t)*(undefined8 *)((long)puVar5 + uVar19));
    pkVar10 = kcontextlist.super__Vector_base<kcontext,_std::allocator<kcontext>_>._M_impl.
              super__Vector_impl_data._M_start;
    *(undefined1 *)
     (kcontextlist.super__Vector_base<kcontext,_std::allocator<kcontext>_>._M_impl.
      super__Vector_impl_data._M_start + uVar25) = 0;
    kmer_00._8_4_ = uVar29;
    kmer_00._0_8_ = in_stack_fffffffffffffb18;
    kmer_00._12_4_ = uVar30;
    kmer_cannonical128((__uint128_t *)skf_ovl.super_KMerFactory128._0_8_,(__uint128_t)kmer_00,
                       (uint8_t)skf_ovl.super_KMerFactory128.last_unknown);
    VAL._8_4_ = uVar29;
    VAL._0_8_ = in_stack_fffffffffffffb18;
    VAL._12_4_ = uVar30;
    bVar12 = in_sorted_vector<unsigned__int128>(V,(unsigned___int128)VAL);
    if (bVar12) {
      *(byte *)(pkVar10 + uVar25) = *(byte *)(pkVar10 + uVar25) | 1;
    }
    kmer_01._8_4_ = uVar29;
    kmer_01._0_8_ = in_stack_fffffffffffffb18;
    kmer_01._12_4_ = uVar30;
    kmer_cannonical128((__uint128_t *)skf_ovl.super_KMerFactory128.fkmer,(__uint128_t)kmer_01,
                       (uint8_t)skf_ovl.super_KMerFactory128.fkmer._8_8_);
    VAL_00._8_4_ = uVar29;
    VAL_00._0_8_ = in_stack_fffffffffffffb18;
    VAL_00._12_4_ = uVar30;
    bVar12 = in_sorted_vector<unsigned__int128>(pvVar24,(unsigned___int128)VAL_00);
    if (bVar12) {
      *(byte *)(pkVar10 + uVar25) = *(byte *)(pkVar10 + uVar25) | 2;
    }
    kmer_02._8_4_ = uVar29;
    kmer_02._0_8_ = in_stack_fffffffffffffb18;
    kmer_02._12_4_ = uVar30;
    kmer_cannonical128((__uint128_t *)skf_ovl.super_KMerFactory128.rkmer,(__uint128_t)kmer_02,
                       (uint8_t)skf_ovl.super_KMerFactory128.rkmer._8_8_);
    VAL_01._8_4_ = uVar29;
    VAL_01._0_8_ = in_stack_fffffffffffffb18;
    VAL_01._12_4_ = uVar30;
    bVar12 = in_sorted_vector<unsigned__int128>(pvVar24,(unsigned___int128)VAL_01);
    if (bVar12) {
      *(byte *)(pkVar10 + uVar25) = *(byte *)(pkVar10 + uVar25) | 4;
    }
    kmer_03._8_4_ = uVar29;
    kmer_03._0_8_ = in_stack_fffffffffffffb18;
    kmer_03._12_4_ = uVar30;
    kmer_cannonical128((__uint128_t *)skf_ovl.super_KMerFactory128.KMER_MASK,(__uint128_t)kmer_03,
                       (uint8_t)skf_ovl.super_KMerFactory128.KMER_MASK._8_8_);
    VAL_02._8_4_ = uVar29;
    VAL_02._0_8_ = in_stack_fffffffffffffb18;
    VAL_02._12_4_ = uVar30;
    bVar12 = in_sorted_vector<unsigned__int128>(pvVar24,(unsigned___int128)VAL_02);
    if (bVar12) {
      *(byte *)(pkVar10 + uVar25) = *(byte *)(pkVar10 + uVar25) | 8;
    }
    kmer_04._8_4_ = uVar29;
    kmer_04._0_8_ = in_stack_fffffffffffffb18;
    kmer_04._12_4_ = uVar30;
    kmer_bw_neighbours128
              (&bns,(__uint128_t)kmer_04,
               (uint8_t)*(undefined8 *)
                         ((long)(pvVar31->
                                super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar19));
    kmer_05._8_4_ = uVar29;
    kmer_05._0_8_ = in_stack_fffffffffffffb18;
    kmer_05._12_4_ = uVar30;
    kmer_cannonical128((__uint128_t *)bns._M_elems[0],(__uint128_t)kmer_05,
                       SUB161((undefined1  [16])bns._M_elems[0] >> 0x40,0));
    VAL_03._8_4_ = uVar29;
    VAL_03._0_8_ = in_stack_fffffffffffffb18;
    VAL_03._12_4_ = uVar30;
    bVar12 = in_sorted_vector<unsigned__int128>(pvVar31,(unsigned___int128)VAL_03);
    if (bVar12) {
      *(byte *)(pkVar10 + uVar25) = *(byte *)(pkVar10 + uVar25) | 0x10;
    }
    kmer_06._8_4_ = uVar29;
    kmer_06._0_8_ = in_stack_fffffffffffffb18;
    kmer_06._12_4_ = uVar30;
    kmer_cannonical128((__uint128_t *)bns._M_elems[1],(__uint128_t)kmer_06,
                       (uint8_t)bns._M_elems[1]._8_8_);
    VAL_04._8_4_ = uVar29;
    VAL_04._0_8_ = in_stack_fffffffffffffb18;
    VAL_04._12_4_ = uVar30;
    bVar12 = in_sorted_vector<unsigned__int128>(pvVar24,(unsigned___int128)VAL_04);
    if (bVar12) {
      *(byte *)(pkVar10 + uVar25) = *(byte *)(pkVar10 + uVar25) | 0x20;
    }
    kmer_07._8_4_ = uVar29;
    kmer_07._0_8_ = in_stack_fffffffffffffb18;
    kmer_07._12_4_ = uVar30;
    kmer_cannonical128((__uint128_t *)bns._M_elems[2],(__uint128_t)kmer_07,
                       (uint8_t)bns._M_elems[2]._8_8_);
    VAL_05._8_4_ = uVar29;
    VAL_05._0_8_ = in_stack_fffffffffffffb18;
    VAL_05._12_4_ = uVar30;
    bVar12 = in_sorted_vector<unsigned__int128>(pvVar24,(unsigned___int128)VAL_05);
    if (bVar12) {
      *(byte *)(pkVar10 + uVar25) = *(byte *)(pkVar10 + uVar25) | 0x40;
    }
    kmer_08._8_4_ = uVar29;
    kmer_08._0_8_ = in_stack_fffffffffffffb18;
    kmer_08._12_4_ = uVar30;
    kmer_cannonical128((__uint128_t *)bns._M_elems[3],(__uint128_t)kmer_08,
                       (uint8_t)bns._M_elems[3]._8_8_);
    VAL_06._8_4_ = uVar29;
    VAL_06._0_8_ = in_stack_fffffffffffffb18;
    VAL_06._12_4_ = uVar30;
    bVar12 = in_sorted_vector<unsigned__int128>(pvVar24,(unsigned___int128)VAL_06);
    if (bVar12) {
      *(byte *)(pkVar10 + uVar25) = *(byte *)(pkVar10 + uVar25) | 0x80;
    }
    uVar19 = uVar19 + 0x10;
    V = pvVar24;
  }
  poVar14 = sdglib::OutputLog(INFO,true);
  poVar14 = std::operator<<(poVar14,"Marking ends");
  std::endl<char,std::char_traits<char>>(poVar14);
  local_4d0 = 0;
  uVar25 = 0;
  while( true ) {
    uVar26 = uVar25;
    pkVar10 = kcontextlist.super__Vector_base<kcontext,_std::allocator<kcontext>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar5 = (V->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar6 = (V->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((ulong)((long)puVar6 - (long)puVar5 >> 4) <= uVar26) break;
    bVar3 = *(byte *)(kcontextlist.super__Vector_base<kcontext,_std::allocator<kcontext>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar26);
    if ((bVar3 >> 4 < 9) && ((0x116U >> (uint)(bVar3 >> 4) & 1) != 0)) {
      uVar13 = 0;
      if (((((bVar3 & 0x10) == 0) && (uVar13 = 1, (bVar3 & 0x20) == 0)) &&
          (uVar13 = 2, (bVar3 & 0x40) == 0)) && (uVar13 = (uint)uVar19, (char)bVar3 < '\0')) {
        uVar13 = 3;
      }
      kmer_09._8_4_ = uVar29;
      kmer_09._0_8_ = in_stack_fffffffffffffb18;
      kmer_09._12_4_ = uVar30;
      kmer_bw_neighbours128
                ((array<unsigned___int128,_4UL> *)&skf_ovl,(__uint128_t)kmer_09,
                 (uint8_t)*(undefined8 *)((long)puVar5 + local_4d0));
      p_Var16 = *(__uint128_t **)
                 (skf_ovl.super_KMerFactory128.b2f._M_elems + (long)(int)uVar13 * 0x10 + -0x50);
      lVar18 = *(long *)(skf_ovl.super_KMerFactory128.b2f._M_elems +
                        (long)(int)uVar13 * 0x10 + -0x48);
      kmer_10._8_4_ = uVar29;
      kmer_10._0_8_ = in_stack_fffffffffffffb18;
      kmer_10._12_4_ = uVar30;
      local_4ac = uVar13;
      skf_ovl.super_KMerFactory128._0_8_ =
           kmer_cannonical128(p_Var16,(__uint128_t)kmer_10,(uint8_t)lVar18);
      skf_ovl.super_KMerFactory128.last_unknown = extraout_RDX;
      _Var15 = std::
               __lower_bound<__gnu_cxx::__normal_iterator<unsigned__int128_const*,std::vector<unsigned__int128,std::allocator<unsigned__int128>>>,unsigned__int128,__gnu_cxx::__ops::_Iter_less_val>
                         (puVar5,puVar6,&skf_ovl);
      pkVar11 = kcontextlist.super__Vector_base<kcontext,_std::allocator<kcontext>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar23 = (long)_Var15._M_current -
               (long)(V->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 2;
      if (lVar18 == skf_ovl.super_KMerFactory128.last_unknown &&
          p_Var16 == (__uint128_t *)skf_ovl.super_KMerFactory128._0_8_) {
        uVar13 = *(byte *)((long)kcontextlist.
                                 super__Vector_base<kcontext,_std::allocator<kcontext>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar23) & 0xf;
        if ((uVar13 < 9) && ((0x116U >> uVar13 & 1) != 0)) goto LAB_00200c7f;
        rVar28 = std::vector<bool,_std::allocator<bool>_>::operator[](&is_end_bw,uVar26);
        *rVar28._M_p = *rVar28._M_p | rVar28._M_mask;
      }
      if ((lVar18 != skf_ovl.super_KMerFactory128.last_unknown ||
           p_Var16 != (__uint128_t *)skf_ovl.super_KMerFactory128._0_8_) &&
         ((uVar13 = (uint)(*(byte *)((long)pkVar11 + lVar23) >> 4), 8 < uVar13 ||
          ((0x116U >> uVar13 & 1) == 0)))) {
        rVar28 = std::vector<bool,_std::allocator<bool>_>::operator[](&is_end_bw,uVar26);
        *rVar28._M_p = *rVar28._M_p | rVar28._M_mask;
      }
    }
    else {
      rVar28 = std::vector<bool,_std::allocator<bool>_>::operator[](&is_end_bw,uVar26);
      *rVar28._M_p = *rVar28._M_p | rVar28._M_mask;
      local_4ac = (uint)uVar19;
    }
LAB_00200c7f:
    bVar3 = *(byte *)(pkVar10 + uVar26);
    if (((bVar3 & 0xf) < 9) && ((0x116U >> (bVar3 & 0xf) & 1) != 0)) {
      iVar21 = 0;
      if (((((bVar3 & 1) == 0) && (iVar21 = 1, (bVar3 & 2) == 0)) && (iVar21 = 2, (bVar3 & 4) == 0))
         && (iVar21 = local_46c, (bVar3 & 8) != 0)) {
        iVar21 = 3;
      }
      puVar5 = (V->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
               _M_impl.super__Vector_impl_data._M_start;
      kmer_11._8_4_ = uVar29;
      kmer_11._0_8_ = in_stack_fffffffffffffb18;
      kmer_11._12_4_ = uVar30;
      pvVar31 = V;
      kmer_fw_neighbours128
                ((array<unsigned___int128,_4UL> *)&skf_ovl,(__uint128_t)kmer_11,
                 (uint8_t)*(undefined8 *)((long)puVar5 + local_4d0));
      p_Var16 = *(__uint128_t **)
                 (skf_ovl.super_KMerFactory128.b2f._M_elems + (long)iVar21 * 0x10 + -0x50);
      lVar18 = *(long *)(skf_ovl.super_KMerFactory128.b2f._M_elems + (long)iVar21 * 0x10 + -0x48);
      kmer_12._8_4_ = uVar29;
      kmer_12._0_8_ = in_stack_fffffffffffffb18;
      kmer_12._12_4_ = uVar30;
      skf_ovl.super_KMerFactory128._0_8_ =
           kmer_cannonical128(p_Var16,(__uint128_t)kmer_12,(uint8_t)lVar18);
      skf_ovl.super_KMerFactory128.last_unknown = extraout_RDX_00;
      _Var15 = std::
               __lower_bound<__gnu_cxx::__normal_iterator<unsigned__int128_const*,std::vector<unsigned__int128,std::allocator<unsigned__int128>>>,unsigned__int128,__gnu_cxx::__ops::_Iter_less_val>
                         (puVar5,(V->
                                 super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                                 )._M_impl.super__Vector_impl_data._M_finish,&skf_ovl);
      pkVar10 = kcontextlist.super__Vector_base<kcontext,_std::allocator<kcontext>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar23 = (long)_Var15._M_current -
               (long)(V->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 2;
      local_46c = iVar21;
      if (lVar18 == skf_ovl.super_KMerFactory128.last_unknown &&
          p_Var16 == (__uint128_t *)skf_ovl.super_KMerFactory128._0_8_) {
        uVar13 = (uint)(*(byte *)((long)kcontextlist.
                                        super__Vector_base<kcontext,_std::allocator<kcontext>_>.
                                        _M_impl.super__Vector_impl_data._M_start + lVar23) >> 4);
        if ((uVar13 < 9) && ((0x116U >> uVar13 & 1) != 0)) goto LAB_00200de5;
        rVar28 = std::vector<bool,_std::allocator<bool>_>::operator[](&is_end_fw,uVar26);
        *rVar28._M_p = *rVar28._M_p | rVar28._M_mask;
      }
      if ((lVar18 != skf_ovl.super_KMerFactory128.last_unknown ||
           p_Var16 != (__uint128_t *)skf_ovl.super_KMerFactory128._0_8_) &&
         ((uVar13 = *(byte *)((long)pkVar10 + lVar23) & 0xf, 8 < uVar13 ||
          ((0x116U >> uVar13 & 1) == 0)))) {
        rVar28 = std::vector<bool,_std::allocator<bool>_>::operator[](&is_end_fw,uVar26);
        *rVar28._M_p = *rVar28._M_p | rVar28._M_mask;
      }
    }
    else {
      rVar28 = std::vector<bool,_std::allocator<bool>_>::operator[](&is_end_fw,uVar26);
      *rVar28._M_p = *rVar28._M_p | rVar28._M_mask;
      pvVar31 = V;
    }
LAB_00200de5:
    local_4d0 = local_4d0 + 0x10;
    uVar19 = (ulong)local_4ac;
    uVar25 = uVar26 + 1;
    V = pvVar31;
    local_4c8 = uVar26;
  }
  poVar14 = sdglib::OutputLog(INFO,true);
  poVar14 = std::operator<<(poVar14,"Creating unitigs");
  std::endl<char,std::char_traits<char>>(poVar14);
  uVar19 = 0;
  do {
    if ((ulong)((long)(V->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>)
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(V->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>)
                      ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar19) {
      poVar14 = sdglib::OutputLog(INFO,true);
      poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
      poVar14 = std::operator<<(poVar14," unitigs");
      std::endl<char,std::char_traits<char>>(poVar14);
      poVar14 = sdglib::OutputLog(INFO,true);
      poVar14 = std::operator<<(poVar14,"doing the circles now");
      std::endl<char,std::char_traits<char>>(poVar14);
      for (uVar19 = 0;
          uVar19 < (ulong)((long)(V->
                                 super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(V->
                                 super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                                 )._M_impl.super__Vector_impl_data._M_start >> 4);
          uVar19 = uVar19 + 1) {
        rVar28 = std::vector<bool,_std::allocator<bool>_>::operator[](&used_kmers,uVar19);
        if ((*rVar28._M_p & rVar28._M_mask) == 0) {
          puVar5 = (V->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          lVar18 = (long)puVar5[uVar19];
          pvVar31 = *(vector<unsigned___int128,_std::allocator<unsigned___int128>_> **)
                     ((long)puVar5 + uVar19 * 0x10 + 8);
          bns._M_elems[0] = 0;
          bns._M_elems[1]._0_8_ = (__uint128_t *)0x0;
          rVar28 = std::vector<bool,_std::allocator<bool>_>::operator[](&used_kmers,uVar19);
          *rVar28._M_p = *rVar28._M_p | rVar28._M_mask;
          kmer_19._8_4_ = uVar29;
          kmer_19._0_8_ = in_stack_fffffffffffffb18;
          kmer_19._12_4_ = uVar30;
          kmer_to_sequence128_abi_cxx11_((string *)&skf_ovl,(__uint128_t)kmer_19,(uint8_t)lVar18);
          std::__cxx11::string::operator=((string *)&s,(string *)&skf_ovl);
          std::__cxx11::string::~string((string *)&skf_ovl);
          pvVar24 = pvVar31;
          lVar23 = lVar18;
          while( true ) {
            kmer_20._8_4_ = uVar29;
            kmer_20._0_8_ = in_stack_fffffffffffffb18;
            kmer_20._12_4_ = uVar30;
            get_fw_idxs128((vector<klidxs128,_std::allocator<klidxs128>_> *)&bns,
                           (__uint128_t)kmer_20,(uint8_t)lVar23,pvVar24);
            lVar23 = *(long *)(__uint128_t *)bns._M_elems[0];
            pvVar24 = *(vector<unsigned___int128,_std::allocator<unsigned___int128>_> **)
                       ((long)(__uint128_t *)bns._M_elems[0] + 8);
            if (lVar23 == lVar18 && pvVar24 == pvVar31) break;
            rVar28 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               (&used_kmers,
                                *(size_type *)((long)(__uint128_t *)bns._M_elems[0] + 0x10));
            *rVar28._M_p = *rVar28._M_p | rVar28._M_mask;
            std::__cxx11::string::push_back((char)&s);
          }
          pSVar4 = this->sg;
          Node::Node(&local_68,&s);
          SequenceDistanceGraph::add_node(pSVar4,&local_68);
          std::__cxx11::string::~string((string *)&local_68);
          bVar12 = Node::is_canonical((this->sg->nodes).
                                      super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                                      super__Vector_impl_data._M_finish + -1);
          if (!bVar12) {
            Node::make_rc((this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                          super__Vector_impl_data._M_finish + -1);
          }
          std::_Vector_base<klidxs128,_std::allocator<klidxs128>_>::~_Vector_base
                    ((_Vector_base<klidxs128,_std::allocator<klidxs128>_> *)&bns);
        }
      }
      poVar14 = sdglib::OutputLog(INFO,true);
      poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
      poVar14 = std::operator<<(poVar14," unitigs");
      std::endl<char,std::char_traits<char>>(poVar14);
      in.
      super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      in.
      super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      in.
      super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      out.
      super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      out.
      super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      out.
      super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
      ::reserve(&in,(((long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl
                           .super__Vector_impl_data._M_start) / 0x38) * 2);
      std::
      vector<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
      ::reserve(&out,(((long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0x38) * 2);
      KMerFactory128::KMerFactory128(&skf_ovl.super_KMerFactory128,(char)uVar29 + 0xff);
      local_4b8 = 1;
      while( true ) {
        pNVar7 = (this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar18 = (long)(this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pNVar7;
        if ((ulong)(lVar18 / 0x38) <= local_4b8) break;
        first.
        super__Vector_base<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        last.
        super__Vector_base<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        first.
        super__Vector_base<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        first.
        super__Vector_base<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        last.
        super__Vector_base<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        last.
        super__Vector_base<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        std::__cxx11::string::substr((ulong)&bns,(ulong)(pNVar7 + local_4b8));
        CStringKMerFactory128::create_kmers_direction
                  (&skf_ovl,(vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
                             *)&first.
                                super__Vector_base<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
                   ,(char *)(__uint128_t *)bns._M_elems[0]);
        std::__cxx11::string::~string((string *)&bns);
        this_00 = (vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>>
                   *)&in;
        if ((first.
             super__Vector_base<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->second != false) {
          this_00 = (vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>>
                     *)&out;
        }
        std::
        vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>>::
        emplace_back<unsigned__int128&,unsigned_long&>
                  (this_00,&(first.
                             super__Vector_base<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->first,&local_4b8);
        std::__cxx11::string::substr
                  ((ulong)&bns,
                   (ulong)((this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl
                           .super__Vector_impl_data._M_start + local_4b8));
        CStringKMerFactory128::create_kmers_direction
                  (&skf_ovl,(vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
                             *)&last.
                                super__Vector_base<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
                   ,(char *)(__uint128_t *)bns._M_elems[0]);
        std::__cxx11::string::~string((string *)&bns);
        if ((last.
             super__Vector_base<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->second == true) {
          bns._M_elems[0] = CONCAT88(bns._M_elems[0]._8_8_,-local_4b8);
          std::
          vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>>
          ::emplace_back<unsigned__int128&,unsigned_long>
                    ((vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>>
                      *)&in,&(last.
                              super__Vector_base<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->first,
                     (unsigned_long *)&bns);
        }
        else {
          bns._M_elems[0] = CONCAT88(bns._M_elems[0]._8_8_,-local_4b8);
          std::
          vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>>
          ::emplace_back<unsigned__int128&,unsigned_long>
                    ((vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>>
                      *)&out,&(last.
                               super__Vector_base<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->first,
                     (unsigned_long *)&bns);
        }
        std::
        _Vector_base<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
        ::~_Vector_base(&last.
                         super__Vector_base<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
                       );
        std::
        _Vector_base<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
        ::~_Vector_base(&first.
                         super__Vector_base<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
                       );
        local_4b8 = local_4b8 + 1;
      }
      std::
      __sort<__gnu_cxx::__normal_iterator<std::pair<unsigned__int128,long>*,std::vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (in.
                 super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 in.
                 super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,lVar18 % 0x38);
      std::
      __sort<__gnu_cxx::__normal_iterator<std::pair<unsigned__int128,long>*,std::vector<std::pair<unsigned__int128,long>,std::allocator<std::pair<unsigned__int128,long>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (out.
                 super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 out.
                 super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      ppVar9 = in.
               super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ppVar20 = in.
                super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar19 = 0;
      do {
        if (ppVar20 == ppVar9) {
          poVar14 = sdglib::OutputLog(INFO,true);
          poVar14 = std::operator<<(poVar14,"Graph construction finished");
          std::endl<char,std::char_traits<char>>(poVar14);
          std::
          _Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
          ::~_Vector_base(&out.
                           super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                         );
          std::
          _Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
          ::~_Vector_base(&in.
                           super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                         );
          std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                    (&is_end_bw.super__Bvector_base<std::allocator<bool>_>);
          std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                    (&is_end_fw.super__Bvector_base<std::allocator<bool>_>);
          std::_Vector_base<kcontext,_std::allocator<kcontext>_>::~_Vector_base
                    (&kcontextlist.super__Vector_base<kcontext,_std::allocator<kcontext>_>);
          std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                    (&used_kmers.super__Bvector_base<std::allocator<bool>_>);
          std::__cxx11::string::~string((string *)&s);
          return;
        }
        uVar25 = (long)out.
                       super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)out.
                       super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
        if (uVar25 < uVar19) {
          uVar25 = uVar19;
        }
        ppVar22 = out.
                  super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar19;
        while ((uVar26 = uVar25, uVar25 != uVar19 &&
               (uVar8 = *(ulong *)((long)&ppVar22->first + 8),
               puVar1 = (ulong *)((long)&ppVar20->first + 8), uVar26 = uVar19,
               uVar8 < *puVar1 ||
               uVar8 - *puVar1 < (ulong)((ulong)ppVar22->first < (ulong)ppVar20->first)))) {
          uVar19 = uVar19 + 1;
          ppVar22 = ppVar22 + 1;
        }
        uVar25 = uVar26 << 5 | 0x10;
        for (uVar19 = uVar26;
            uVar19 < (ulong)((long)out.
                                   super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)out.
                                   super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5);
            uVar19 = uVar19 + 1) {
          pcVar2 = (char *)((long)out.
                                  super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + (uVar25 - 0x10));
          auVar27[0] = -(*pcVar2 == (char)ppVar20->first);
          auVar27[1] = -(pcVar2[1] == *(char *)((long)&ppVar20->first + 1));
          auVar27[2] = -(pcVar2[2] == *(char *)((long)&ppVar20->first + 2));
          auVar27[3] = -(pcVar2[3] == *(char *)((long)&ppVar20->first + 3));
          auVar27[4] = -(pcVar2[4] == *(char *)((long)&ppVar20->first + 4));
          auVar27[5] = -(pcVar2[5] == *(char *)((long)&ppVar20->first + 5));
          auVar27[6] = -(pcVar2[6] == *(char *)((long)&ppVar20->first + 6));
          auVar27[7] = -(pcVar2[7] == *(char *)((long)&ppVar20->first + 7));
          auVar27[8] = -(pcVar2[8] == *(char *)((long)&ppVar20->first + 8));
          auVar27[9] = -(pcVar2[9] == *(char *)((long)&ppVar20->first + 9));
          auVar27[10] = -(pcVar2[10] == *(char *)((long)&ppVar20->first + 10));
          auVar27[0xb] = -(pcVar2[0xb] == *(char *)((long)&ppVar20->first + 0xb));
          auVar27[0xc] = -(pcVar2[0xc] == *(char *)((long)&ppVar20->first + 0xc));
          auVar27[0xd] = -(pcVar2[0xd] == *(char *)((long)&ppVar20->first + 0xd));
          auVar27[0xe] = -(pcVar2[0xe] == *(char *)((long)&ppVar20->first + 0xe));
          auVar27[0xf] = -(pcVar2[0xf] == *(char *)((long)&ppVar20->first + 0xf));
          if ((ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar27[0xf] >> 7) << 0xf) != 0xffff) break;
          DistanceGraph::add_link
                    (&this->sg->super_DistanceGraph,ppVar20->second,
                     *(sgNodeID_t *)
                      ((long)&(out.
                               super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->first + uVar25),
                     1 - uVar29,(Support)ZEXT816(0));
          uVar25 = uVar25 + 0x20;
        }
        ppVar20 = ppVar20 + 1;
        uVar19 = uVar26;
      } while( true );
    }
    rVar28 = std::vector<bool,_std::allocator<bool>_>::operator[](&used_kmers,uVar19);
    if ((*rVar28._M_p & rVar28._M_mask) == 0) {
      puVar5 = (V->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
               _M_impl.super__Vector_impl_data._M_start;
      p_Var16 = *(__uint128_t **)(puVar5 + uVar19);
      lVar18 = *(long *)((long)puVar5 + uVar19 * 0x10 + 8);
      rVar28 = std::vector<bool,_std::allocator<bool>_>::operator[](&is_end_bw,uVar19);
      bns._M_elems[0] =
           (unsigned___int128)
           std::vector<bool,_std::allocator<bool>_>::operator[](&is_end_fw,uVar19);
      if ((*rVar28._M_p & rVar28._M_mask) == 0) {
        if ((*(ulong *)bns._M_elems[0] & SUB168(bns._M_elems[0],8)) != 0) goto LAB_00200f16;
      }
      else {
        if ((*(ulong *)bns._M_elems[0] & SUB168(bns._M_elems[0],8)) == 0) {
LAB_00200f16:
          rVar28 = std::vector<bool,_std::allocator<bool>_>::operator[](&used_kmers,uVar19);
          *rVar28._M_p = *rVar28._M_p | rVar28._M_mask;
          pvVar31 = V;
          if ((*(ulong *)(__uint128_t *)bns._M_elems[0] & bns._M_elems[0]._8_8_) != 0) {
            kmer_14._8_4_ = uVar29;
            kmer_14._0_8_ = in_stack_fffffffffffffb18;
            kmer_14._12_4_ = uVar30;
            p_Var16 = kmer_reverse128(p_Var16,(__uint128_t)kmer_14,(uint8_t)lVar18);
            __x._M_p._4_4_ = uVar30;
            __x._M_p._0_4_ = uVar29;
            __x._M_mask = (_Bit_type)V;
            __y._M_mask = in_stack_fffffffffffffb18;
            __y._M_p = (_Bit_type *)0x200f6a;
            std::swap(__x,__y);
            lVar18 = extraout_RDX_01;
            pvVar31 = V;
          }
          kmer_15._8_4_ = uVar29;
          kmer_15._0_8_ = in_stack_fffffffffffffb18;
          kmer_15._12_4_ = uVar30;
          kmer_to_sequence128_abi_cxx11_((string *)&skf_ovl,(__uint128_t)kmer_15,(uint8_t)p_Var16);
          std::__cxx11::string::operator=((string *)&s,(string *)&skf_ovl);
          std::__cxx11::string::~string((string *)&skf_ovl);
          uVar25 = uVar19;
          while( true ) {
            V = pvVar31;
            if ((*(ulong *)(__uint128_t *)bns._M_elems[0] & bns._M_elems[0]._8_8_) != 0) break;
            bVar3 = *(byte *)(kcontextlist.super__Vector_base<kcontext,_std::allocator<kcontext>_>.
                              _M_impl.super__Vector_impl_data._M_start + uVar25);
            kmer_16._8_4_ = uVar29;
            kmer_16._0_8_ = in_stack_fffffffffffffb18;
            kmer_16._12_4_ = uVar30;
            p_Var17 = kmer_cannonical128(p_Var16,(__uint128_t)kmer_16,(uint8_t)lVar18);
            if (p_Var17 == p_Var16 && extraout_RDX_02 == lVar18) {
              uVar13 = 0;
              if ((((bVar3 & 1) == 0) && (uVar13 = 1, (bVar3 & 2) == 0)) &&
                 ((uVar13 = 2, (bVar3 & 4) == 0 && (uVar13 = (uint)local_4c8, (bVar3 & 8) != 0)))) {
                uVar13 = 3;
              }
            }
            else {
              uVar13 = 3;
              if (((((bVar3 & 0x10) == 0) && (uVar13 = 2, (bVar3 & 0x20) == 0)) &&
                  (uVar13 = 1, (bVar3 & 0x40) == 0)) &&
                 (uVar13 = (uint)local_4c8, (char)bVar3 < '\0')) {
                uVar13 = 0;
              }
            }
            kmer_17._8_4_ = uVar29;
            kmer_17._0_8_ = in_stack_fffffffffffffb18;
            kmer_17._12_4_ = uVar30;
            kmer_fw_neighbours128
                      ((array<unsigned___int128,_4UL> *)&skf_ovl,(__uint128_t)kmer_17,
                       (uint8_t)p_Var16);
            p_Var16 = *(__uint128_t **)
                       (skf_ovl.super_KMerFactory128.b2f._M_elems + (long)(int)uVar13 * 0x10 + -0x50
                       );
            lVar18 = *(long *)(skf_ovl.super_KMerFactory128.b2f._M_elems +
                              (long)(int)uVar13 * 0x10 + -0x48);
            kmer_18._8_4_ = uVar29;
            kmer_18._0_8_ = in_stack_fffffffffffffb18;
            kmer_18._12_4_ = uVar30;
            skf_ovl.super_KMerFactory128._0_8_ =
                 kmer_cannonical128(p_Var16,(__uint128_t)kmer_18,(uint8_t)lVar18);
            V = pvVar31;
            skf_ovl.super_KMerFactory128.last_unknown = extraout_RDX_03;
            _Var15 = std::
                     __lower_bound<__gnu_cxx::__normal_iterator<unsigned__int128_const*,std::vector<unsigned__int128,std::allocator<unsigned__int128>>>,unsigned__int128,__gnu_cxx::__ops::_Iter_less_val>
                               ((pvVar31->
                                super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                                )._M_impl.super__Vector_impl_data._M_start,
                                (pvVar31->
                                super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                                )._M_impl.super__Vector_impl_data._M_finish,&skf_ovl);
            uVar25 = (long)_Var15._M_current -
                     (long)(pvVar31->
                           super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 4;
            rVar28 = std::vector<bool,_std::allocator<bool>_>::operator[](&used_kmers,uVar25);
            if ((*rVar28._M_p & rVar28._M_mask) != 0) {
              local_4c8 = (ulong)uVar13;
              break;
            }
            rVar28 = std::vector<bool,_std::allocator<bool>_>::operator[](&used_kmers,uVar25);
            *rVar28._M_p = *rVar28._M_p | rVar28._M_mask;
            std::__cxx11::string::push_back((char)&s);
            if (skf_ovl.super_KMerFactory128.last_unknown == lVar18 &&
                (__uint128_t *)skf_ovl.super_KMerFactory128._0_8_ == p_Var16) {
              in.
              super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
              ._M_impl.super__Vector_impl_data._0_16_ =
                   std::vector<bool,_std::allocator<bool>_>::operator[](&is_end_fw,uVar25);
              pvVar31 = V;
            }
            else {
              in.
              super__Vector_base<std::pair<unsigned___int128,_long>,_std::allocator<std::pair<unsigned___int128,_long>_>_>
              ._M_impl.super__Vector_impl_data._0_16_ =
                   std::vector<bool,_std::allocator<bool>_>::operator[](&is_end_bw,uVar25);
              pvVar31 = V;
            }
            std::_Bit_reference::operator=((_Bit_reference *)&bns,(_Bit_reference *)&in);
            local_4c8 = (ulong)uVar13;
          }
        }
        else {
          kmer_13._8_4_ = uVar29;
          kmer_13._0_8_ = in_stack_fffffffffffffb18;
          kmer_13._12_4_ = uVar30;
          kmer_to_sequence128_abi_cxx11_((string *)&skf_ovl,(__uint128_t)kmer_13,(uint8_t)p_Var16);
          std::__cxx11::string::operator=((string *)&s,(string *)&skf_ovl);
          std::__cxx11::string::~string((string *)&skf_ovl);
          rVar28 = std::vector<bool,_std::allocator<bool>_>::operator[](&used_kmers,uVar19);
          *rVar28._M_p = *rVar28._M_p | rVar28._M_mask;
        }
        pSVar4 = this->sg;
        Node::Node(&local_a0,&s);
        SequenceDistanceGraph::add_node(pSVar4,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        bVar12 = Node::is_canonical((this->sg->nodes).
                                    super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                                    super__Vector_impl_data._M_finish + -1);
        if (!bVar12) {
          Node::make_rc((this->sg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                        super__Vector_impl_data._M_finish + -1);
        }
      }
    }
    uVar19 = uVar19 + 1;
  } while( true );
}

Assistant:

void GraphMaker::new_graph_from_kmerlist_128(const std::vector<__uint128_t> & kmerlist,uint8_t k) {
    //TODO: add a bloom filter to speed this up
    sg.nodes.clear();
    sg.links.clear();
    sg.oldnames.clear();
    sg.add_node(Node("",NodeStatus::Deleted));
    sdglib::OutputLog()<<"Constructing Graph from "<<kmerlist.size()<<" "<<std::to_string(k)<<"-mers"<<std::endl;
    std::string s;
    s.reserve(1000000); //avoid contig-sequence growth
    std::vector<bool> used_kmers(kmerlist.size());
    std::vector<kcontext> kcontextlist(kmerlist.size());
    std::vector<bool> is_end_fw(kmerlist.size());
    std::vector<bool> is_end_bw(kmerlist.size());
    sdglib::OutputLog()<<"Finding neighbours"<<std::endl;
#pragma omp parallel for
    for (uint64_t i=0;i<kmerlist.size();++i){
        auto fns=kmer_fw_neighbours128(kmerlist[i], k);
        auto &c=kcontextlist[i];
        c.fb.fw=0;
        c.fb.bw=0;
        if (in_sorted_vector(kmerlist,kmer_cannonical128(fns[0],k))) c.sbcont.fA=1;
        if (in_sorted_vector(kmerlist,kmer_cannonical128(fns[1],k))) c.sbcont.fC=1;
        if (in_sorted_vector(kmerlist,kmer_cannonical128(fns[2],k))) c.sbcont.fG=1;
        if (in_sorted_vector(kmerlist,kmer_cannonical128(fns[3],k))) c.sbcont.fT=1;
        auto bns=kmer_bw_neighbours128(kmerlist[i], k);
        if (in_sorted_vector(kmerlist,kmer_cannonical128(bns[0],k))) c.sbcont.bA=1;
        if (in_sorted_vector(kmerlist,kmer_cannonical128(bns[1],k))) c.sbcont.bC=1;
        if (in_sorted_vector(kmerlist,kmer_cannonical128(bns[2],k))) c.sbcont.bG=1;
        if (in_sorted_vector(kmerlist,kmer_cannonical128(bns[3],k))) c.sbcont.bT=1;
    }
    sdglib::OutputLog()<<"Marking ends"<<std::endl;
#pragma omp parallel for
    for (uint64_t i=0;i<kmerlist.size();++i) {
        auto &c=kcontextlist[i];
        if (c.fb.bw!=1 and c.fb.bw!=2 and c.fb.bw!=4 and c.fb.bw!=8 ) {
            is_end_bw[i]=true;
        } else {
            int nn;
            if (c.sbcont.bA) nn=0;
            else if (c.sbcont.bC) nn=1;
            else if (c.sbcont.bG) nn=2;
            else if (c.sbcont.bT) nn=3;
            auto next=kmer_bw_neighbours128(kmerlist[i],k)[nn];
            auto cnext=kmer_cannonical128(next,k);
            auto ni=std::lower_bound(kmerlist.begin(),kmerlist.end(),cnext)-kmerlist.begin();
            auto &nc=kcontextlist[ni];
            if (next==cnext and nc.fb.fw!=1 and nc.fb.fw!=2 and nc.fb.fw!=4 and nc.fb.fw!=8) is_end_bw[i]=true;
            if (next!=cnext and nc.fb.bw!=1 and nc.fb.bw!=2 and nc.fb.bw!=4 and nc.fb.bw!=8) is_end_bw[i]=true;
        }
        if (c.fb.fw!=1 and c.fb.fw!=2 and c.fb.fw!=4 and c.fb.fw!=8 ) {
            is_end_fw[i]=true;
        } else {
            int nn;
            if (c.sbcont.fA) nn=0;
            else if (c.sbcont.fC) nn=1;
            else if (c.sbcont.fG) nn=2;
            else if (c.sbcont.fT) nn=3;
            auto next=kmer_fw_neighbours128(kmerlist[i],k)[nn];
            auto cnext=kmer_cannonical128(next,k);
            auto ni=std::lower_bound(kmerlist.begin(),kmerlist.end(),cnext)-kmerlist.begin();
            auto &nc=kcontextlist[ni];
            if (next==cnext and nc.fb.bw!=1 and nc.fb.bw!=2 and nc.fb.bw!=4 and nc.fb.bw!=8) is_end_fw[i]=true;
            if (next!=cnext and nc.fb.fw!=1 and nc.fb.fw!=2 and nc.fb.fw!=4 and nc.fb.fw!=8) is_end_fw[i]=true;
        }
    }
    sdglib::OutputLog()<<"Creating unitigs"<<std::endl;

    for (uint64_t start_kmer_idx=0;start_kmer_idx<kmerlist.size();++start_kmer_idx) {
        if (used_kmers[start_kmer_idx]) continue; //any kmer can only belong to one unitig.ww

        //Check this k-mer is an end/junction
        auto start_kmer = kmerlist[start_kmer_idx];


        auto end_bw=is_end_bw[start_kmer_idx];
        auto end_fw=is_end_fw[start_kmer_idx];

        if (!end_bw and !end_fw) continue;

        if (end_bw and end_fw) {
            //kmer as unitig
            s=kmer_to_sequence128(start_kmer, k);
            used_kmers[start_kmer_idx] = true;
        } else {
            //unitig start on kmer
            //make sure the unitig starts on FW

            auto current_kmer = start_kmer;
            auto current_idx = start_kmer_idx;
            used_kmers[start_kmer_idx] = true;

            if (end_fw) {
                current_kmer = kmer_reverse128(start_kmer, k);
                std::swap(end_fw,end_bw);
            }

            //Add kmer as unitig
            s=kmer_to_sequence128(current_kmer, k);

            unsigned char nucleotides[4] = {'A', 'C', 'G', 'T'};



            //std::cout<<"Starting sequence construction at kmer "<<kmer_to_sequence128(current_kmer,k)<<std::endl;
            while (!end_fw) {
                //Add end nucleotide, update current_kmer;
                //get_fw_idxs128(fwn, current_kmer, k, kmerlist);
                auto c=kcontextlist[current_idx];
                int nn;
                if (kmer_cannonical128(current_kmer,k)==current_kmer) {
                    if (c.sbcont.fA) nn = 0;
                    else if (c.sbcont.fC) nn = 1;
                    else if (c.sbcont.fG) nn = 2;
                    else if (c.sbcont.fT) nn = 3;
                }
                else{
                    if (c.sbcont.bA) nn = 3;
                    else if (c.sbcont.bC) nn = 2;
                    else if (c.sbcont.bG) nn = 1;
                    else if (c.sbcont.bT) nn = 0;
                }
                current_kmer=kmer_fw_neighbours128(current_kmer,k)[nn];
                auto ccurr=kmer_cannonical128(current_kmer,k);
                current_idx=std::lower_bound(kmerlist.begin(),kmerlist.end(),ccurr)-kmerlist.begin();
                if (used_kmers[current_idx]) break; //this should never happen, since these have ends.
                used_kmers[current_idx]=true;
                s.push_back(nucleotides[current_kmer % 4]);
                if (ccurr==current_kmer) end_fw = is_end_fw[current_idx];
                else end_fw = is_end_bw[current_idx];
            }
        }
        sg.add_node(Node(s));
        if (!sg.nodes.back().is_canonical()) sg.nodes.back().make_rc();//inefficient, but once in a node
    }
    sdglib::OutputLog()<<sg.nodes.size()<<" unitigs"<<std::endl;
    //If there are any perfect circles, they won't have ends, so just pick any unused kmer and go fw till you find the same k-mer fw.
    //(this is going to be even tricker to parallelise)
    sdglib::OutputLog()<<"doing the circles now"<<std::endl;
    for (uint64_t start_kmer_idx=0;start_kmer_idx<kmerlist.size();++start_kmer_idx) {
        if (used_kmers[start_kmer_idx]) continue; //any kmer can only belong to one unitig.ww

        //Check this k-mer is an end/junction
        auto start_kmer = kmerlist[start_kmer_idx];
        std::vector<klidxs128> fwn;
        unsigned char nucleotides[4] = {'A', 'C', 'G', 'T'};
        auto current_kmer = start_kmer;
        used_kmers[start_kmer_idx] = true;
        s=kmer_to_sequence128(current_kmer, k);

        while (true) {
            //Add end nucleotide, update current_kmer;
            get_fw_idxs128(fwn, current_kmer, k, kmerlist);
            current_kmer = fwn[0].kmer;
            if (current_kmer==start_kmer) break;
            used_kmers[fwn[0].idx] = true;
            s.push_back(nucleotides[current_kmer % 4]);
        }
        sg.add_node(Node(s));
        if (!sg.nodes.back().is_canonical()) sg.nodes.back().make_rc();//inefficient, but once in a node
    }
    sdglib::OutputLog()<<sg.nodes.size()<<" unitigs"<<std::endl;

    //save the (k-1)mer in (rev on first k-1 / fw on last k-1) or out ( fw on first k-1 / bw on last k-1)
    std::vector<std::pair<__uint128_t,sgNodeID_t>> in, out;
    in.reserve(2*sg.nodes.size());
    out.reserve(2*sg.nodes.size());
    CStringKMerFactory128 skf_ovl(k-1);
    for (uint64_t nid=1;nid<sg.nodes.size();++nid){
        std::vector<std::pair<__uint128_t,bool>> first,last;
        skf_ovl.create_kmers_direction(first,sg.nodes[nid].sequence.substr(0,k-1).c_str());
        if (first[0].second) out.emplace_back(first[0].first,nid);
        else in.emplace_back(first[0].first,nid);
        skf_ovl.create_kmers_direction(last,sg.nodes[nid].sequence.substr(sg.nodes[nid].sequence.size()-k+1,k-1).c_str());
        if (last[0].second) in.emplace_back(last[0].first,-nid);
        else out.emplace_back(last[0].first,-nid);
    }
    std::sort(in.begin(),in.end());
    std::sort(out.begin(),out.end());
    //connect out->in for all combinations on each kmer
    uint64_t next_out_idx=0;
    for(auto &i:in){
        while(next_out_idx<out.size() and out[next_out_idx].first<i.first) ++next_out_idx;
        for (auto oidx=next_out_idx;oidx<out.size() and out[oidx].first==i.first;++oidx) {
            sg.add_link(i.second,out[oidx].second,-k+1); //no support, although we could add the DBG operation as such
        }
    }
    sdglib::OutputLog()<<"Graph construction finished"<<std::endl;
}